

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O2

obj * worst_cursed_item(void)

{
  boolean bVar1;
  int iVar2;
  obj **ppoVar3;
  
  iVar2 = near_capacity();
  if (iVar2 < 3) {
LAB_002148cb:
    iVar2 = welded(uwep);
    if ((((((iVar2 == 0) ||
           ((ppoVar3 = &uwep->nobj, uright == (obj *)0x0 &&
            (((byte)(uwep->oclass | 4U) != 6 || ((objects[uwep->otyp].field_0x11 & 1) == 0)))))) &&
          ((uarmg == (obj *)0x0 || (ppoVar3 = &uarmg->nobj, (uarmg->field_0x4a & 1) == 0)))) &&
         ((((uarms == (obj *)0x0 || (ppoVar3 = &uarms->nobj, (uarms->field_0x4a & 1) == 0)) &&
           ((uarmc == (obj *)0x0 || (ppoVar3 = &uarmc->nobj, (uarmc->field_0x4a & 1) == 0)))) &&
          ((uarm == (obj *)0x0 || (ppoVar3 = &uarm->nobj, (uarm->field_0x4a & 1) == 0)))))) &&
        ((((uarmh == (obj *)0x0 || (ppoVar3 = &uarmh->nobj, (uarmh->field_0x4a & 1) == 0)) &&
          ((((uarmf == (obj *)0x0 || (ppoVar3 = &uarmf->nobj, (uarmf->field_0x4a & 1) == 0)) &&
            ((uarmu == (obj *)0x0 || (ppoVar3 = &uarmu->nobj, (uarmu->field_0x4a & 1) == 0)))) &&
           ((uamul == (obj *)0x0 || (ppoVar3 = &uamul->nobj, (uamul->field_0x4a & 1) == 0)))))) &&
         ((uleft == (obj *)0x0 || (ppoVar3 = &uleft->nobj, (uleft->field_0x4a & 1) == 0)))))) &&
       ((((uright == (obj *)0x0 || (ppoVar3 = &uright->nobj, (uright->field_0x4a & 1) == 0)) &&
         ((ublindf == (obj *)0x0 || (ppoVar3 = &ublindf->nobj, (ublindf->field_0x4a & 1) == 0)))) &&
        ((iVar2 = welded(uwep), ppoVar3 = &uwep->nobj, iVar2 == 0 &&
         (((uswapwep == (obj *)0x0 || ((uswapwep->field_0x4a & 1) == 0)) ||
          (ppoVar3 = &uswapwep->nobj, u.twoweap == '\0')))))))) {
      ppoVar3 = &invent;
      while (ppoVar3 = &((obj *)ppoVar3)->nobj->nobj, (obj *)ppoVar3 != (obj *)0x0) {
        if ((((obj *)ppoVar3)->field_0x4a & 1) != 0) {
          if (((obj *)ppoVar3)->otyp == 0x210) {
            return (obj *)ppoVar3;
          }
          bVar1 = confers_luck((obj *)ppoVar3);
          if (bVar1 != '\0') {
            return (obj *)ppoVar3;
          }
        }
      }
      ppoVar3 = &((obj *)0x0)->nobj;
    }
  }
  else {
    ppoVar3 = &invent;
    do {
      ppoVar3 = &((obj *)ppoVar3)->nobj->nobj;
      if ((obj *)ppoVar3 == (obj *)0x0) goto LAB_002148cb;
    } while ((((obj *)ppoVar3)->otyp != 0x210) || ((((obj *)ppoVar3)->field_0x4a & 1) == 0));
  }
  return (obj *)ppoVar3;
}

Assistant:

static struct obj *worst_cursed_item(void)
{
    struct obj *otmp;

    /* if strained or worse, check for loadstone first */
    if (near_capacity() >= HVY_ENCUMBER) {
	for (otmp = invent; otmp; otmp = otmp->nobj)
	    if (Cursed_obj(otmp, LOADSTONE)) return otmp;
    }
    /* weapon takes precedence if it is interfering
       with taking off a ring or putting on a shield */
    if (welded(uwep) && (uright || bimanual(uwep))) {	/* weapon */
	otmp = uwep;
    /* gloves come next, due to rings */
    } else if (uarmg && uarmg->cursed) {		/* gloves */
	otmp = uarmg;
    /* then shield due to two handed weapons and spells */
    } else if (uarms && uarms->cursed) {		/* shield */
	otmp = uarms;
    /* then cloak due to body armor */
    } else if (uarmc && uarmc->cursed) {		/* cloak */
	otmp = uarmc;
    } else if (uarm && uarm->cursed) {			/* suit */
	otmp = uarm;
    } else if (uarmh && uarmh->cursed) {		/* helmet */
	otmp = uarmh;
    } else if (uarmf && uarmf->cursed) {		/* boots */
	otmp = uarmf;
    } else if (uarmu && uarmu->cursed) {		/* shirt */
	otmp = uarmu;
    } else if (uamul && uamul->cursed) {		/* amulet */
	otmp = uamul;
    } else if (uleft && uleft->cursed) {		/* left ring */
	otmp = uleft;
    } else if (uright && uright->cursed) {		/* right ring */
	otmp = uright;
    } else if (ublindf && ublindf->cursed) {		/* eyewear */
	otmp = ublindf;	/* must be non-blinding lenses */
    /* if weapon wasn't handled above, do it now */
    } else if (welded(uwep)) {				/* weapon */
	otmp = uwep;
    /* active secondary weapon even though it isn't welded */
    } else if (uswapwep && uswapwep->cursed && u.twoweap) {
	otmp = uswapwep;
    /* all worn items ought to be handled by now */
    } else {
	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    if (!otmp->cursed) continue;
	    if (otmp->otyp == LOADSTONE || confers_luck(otmp))
		break;
	}
    }
    return otmp;
}